

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

string * __thiscall
flatbuffers::EnumDef::AllFlags_abi_cxx11_(string *__return_storage_ptr__,EnumDef *this)

{
  Value *pVVar1;
  pointer ppEVar2;
  unsigned_long t;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"bit_flags",&local_39);
  pVVar1 = SymbolTable<flatbuffers::Value>::Lookup(&(this->super_Definition).attributes,&local_38);
  if (pVVar1 != (Value *)0x0) {
    std::__cxx11::string::~string((string *)&local_38);
    t = 0;
    for (ppEVar2 = (this->vals).vec.
                   super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppEVar2 !=
        (this->vals).vec.
        super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppEVar2 = ppEVar2 + 1) {
      t = t | (*ppEVar2)->value;
    }
    if ((this->underlying_type).base_type == BASE_TYPE_ULONG) {
      NumToString<unsigned_long>(__return_storage_ptr__,t);
    }
    else {
      NumToString<long>(__return_storage_ptr__,t);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("attributes.Lookup(\"bit_flags\")",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_parser.cpp"
                ,0x8fb,"std::string flatbuffers::EnumDef::AllFlags() const");
}

Assistant:

std::string EnumDef::AllFlags() const {
  FLATBUFFERS_ASSERT(attributes.Lookup("bit_flags"));
  uint64_t u64 = 0;
  for (auto it = Vals().begin(); it != Vals().end(); ++it) {
    u64 |= (*it)->GetAsUInt64();
  }
  return IsUInt64() ? NumToString(u64) : NumToString(static_cast<int64_t>(u64));
}